

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

bool slang::syntax::PortConnectionSyntax::isKind(SyntaxKind kind)

{
  if ((int)kind < 0x155) {
    if ((kind != EmptyPortConnection) && (kind != NamedPortConnection)) {
      return false;
    }
  }
  else if ((kind != OrderedPortConnection) && (kind != WildcardPortConnection)) {
    return false;
  }
  return true;
}

Assistant:

bool PortConnectionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::EmptyPortConnection:
        case SyntaxKind::NamedPortConnection:
        case SyntaxKind::OrderedPortConnection:
        case SyntaxKind::WildcardPortConnection:
            return true;
        default:
            return false;
    }
}